

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int stat4ValueFromExpr(Parse *pParse,Expr *pExpr,u8 affinity,ValueNewStat4Ctx *pAlloc,
                      sqlite3_value **ppVal)

{
  u32 *puVar1;
  uint uVar2;
  sqlite3 *db;
  int iVar3;
  sqlite3_value *pTo;
  uint uVar4;
  ExprList_item *pEVar5;
  sqlite3_value *pVal;
  sqlite3_value *local_48;
  Vdbe *local_40;
  ulong local_38;
  
  local_48 = (sqlite3_value *)0x0;
  while ((pExpr != (Expr *)0x0 && ((pExpr->flags >> 0xc & 1) != 0))) {
    if ((pExpr->flags >> 0x12 & 1) == 0) {
      pEVar5 = (ExprList_item *)&pExpr->pLeft;
    }
    else {
      pEVar5 = ((pExpr->x).pList)->a;
    }
    pExpr = pEVar5->pExpr;
  }
  db = pParse->db;
  if (pExpr == (Expr *)0x0) {
    local_48 = valueNew(db,pAlloc);
    iVar3 = 0;
    if (local_48 != (sqlite3_value *)0x0) {
      if ((local_48->flags & 0x2400) == 0) {
        local_48->flags = 1;
      }
      else {
        vdbeMemClearExternAndSetNull(local_48);
      }
    }
  }
  else if ((pExpr->op == 0x94) && ((db->flags & 0x800000) == 0)) {
    uVar2._0_2_ = pExpr->iColumn;
    uVar2._2_2_ = pExpr->iAgg;
    local_38 = (ulong)uVar2;
    uVar4 = 0x80000000;
    if ((short)(undefined2)uVar2 < 0x20) {
      uVar4 = 1 << ((char)(undefined2)uVar2 - 1U & 0x1f);
    }
    puVar1 = &pParse->pVdbe->expmask;
    *puVar1 = *puVar1 | uVar4;
    local_40 = pParse->pReprepare;
    iVar3 = 0;
    if (local_40 != (Vdbe *)0x0) {
      pTo = valueNew(db,pAlloc);
      iVar3 = 0;
      local_48 = pTo;
      if (pTo != (sqlite3_value *)0x0) {
        iVar3 = sqlite3VdbeMemCopy(pTo,local_40->aVar + (long)(short)local_38 + -1);
        applyAffinity(pTo,affinity,db->enc);
        pTo->db = pParse->db;
      }
    }
  }
  else {
    iVar3 = valueFromExpr(db,pExpr,db->enc,affinity,&local_48,pAlloc);
  }
  *ppVal = local_48;
  return iVar3;
}

Assistant:

static int stat4ValueFromExpr(
  Parse *pParse,                  /* Parse context */
  Expr *pExpr,                    /* The expression to extract a value from */
  u8 affinity,                    /* Affinity to use */
  struct ValueNewStat4Ctx *pAlloc,/* How to allocate space.  Or NULL */
  sqlite3_value **ppVal           /* OUT: New value object (or NULL) */
){
  int rc = SQLITE_OK;
  sqlite3_value *pVal = 0;
  sqlite3 *db = pParse->db;

  /* Skip over any TK_COLLATE nodes */
  pExpr = sqlite3ExprSkipCollate(pExpr);

  assert( pExpr==0 || pExpr->op!=TK_REGISTER || pExpr->op2!=TK_VARIABLE );
  if( !pExpr ){
    pVal = valueNew(db, pAlloc);
    if( pVal ){
      sqlite3VdbeMemSetNull((Mem*)pVal);
    }
  }else if( pExpr->op==TK_VARIABLE && (db->flags & SQLITE_EnableQPSG)==0 ){
    Vdbe *v;
    int iBindVar = pExpr->iColumn;
    sqlite3VdbeSetVarmask(pParse->pVdbe, iBindVar);
    if( (v = pParse->pReprepare)!=0 ){
      pVal = valueNew(db, pAlloc);
      if( pVal ){
        rc = sqlite3VdbeMemCopy((Mem*)pVal, &v->aVar[iBindVar-1]);
        sqlite3ValueApplyAffinity(pVal, affinity, ENC(db));
        pVal->db = pParse->db;
      }
    }
  }else{
    rc = valueFromExpr(db, pExpr, ENC(db), affinity, &pVal, pAlloc);
  }

  assert( pVal==0 || pVal->db==db );
  *ppVal = pVal;
  return rc;
}